

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

Node * prvTidyParseNamespace(TidyDocImpl *doc,Node *basenode,GetTokenMode mode)

{
  Node *pNVar1;
  bool bVar2;
  Node *local_78;
  Node *local_68;
  Node *n;
  Node *mp;
  AttVal *pAStack_50;
  Bool outside;
  AttVal *av;
  Node *pNStack_40;
  uint istackbase;
  Node *parent;
  Node *node;
  Lexer *lexer;
  Node *pNStack_20;
  GetTokenMode mode_local;
  Node *basenode_local;
  TidyDocImpl *doc_local;
  
  node = (Node *)doc->lexer;
  pNStack_40 = basenode;
  lexer._4_4_ = mode;
  pNStack_20 = basenode;
  basenode_local = &doc->root;
  prvTidyDeferDup(doc);
  av._4_4_ = *(undefined4 *)&node[1].attributes;
  *(undefined4 *)&node[1].attributes = *(undefined4 *)((long)&node[1].last + 4);
  lexer._4_4_ = OtherNamespace;
  do {
    while( true ) {
      while( true ) {
        parent = prvTidyGetToken((TidyDocImpl *)basenode_local,lexer._4_4_);
        if (parent == (Node *)0x0) {
          prvTidyReport((TidyDocImpl *)basenode_local,pNStack_20->parent,pNStack_20,0x25a);
          return (Node *)0x0;
        }
        if (parent->type == EndTag) break;
        if (parent->type == StartTag) {
          for (pAStack_50 = parent->attributes; pAStack_50 != (AttVal *)0x0;
              pAStack_50 = pAStack_50->next) {
            pAStack_50->dict = (Attribute *)0x0;
          }
          prvTidyInsertNodeAtEnd(pNStack_40,parent);
          pNStack_40 = parent;
        }
        else {
          for (pAStack_50 = parent->attributes; pAStack_50 != (AttVal *)0x0;
              pAStack_50 = pAStack_50->next) {
            pAStack_50->dict = (Attribute *)0x0;
          }
          prvTidyInsertNodeAtEnd(pNStack_40,parent);
        }
      }
      pNVar1 = FindMatchingDescendant(pNStack_40,parent,pNStack_20,(Bool *)((long)&mp + 4));
      if (pNVar1 != (Node *)0x0) break;
      prvTidyReport((TidyDocImpl *)basenode_local,pNStack_40,parent,0x235);
      if (pNStack_40 == (Node *)0x0) {
        __assert_fail("parent",
                      "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/parser.c"
                      ,0x1018,"Node *prvTidyParseNamespace(TidyDocImpl *, Node *, GetTokenMode)");
      }
      prvTidyFreeNode((TidyDocImpl *)basenode_local,parent);
    }
    local_68 = pNStack_40;
    while( true ) {
      bVar2 = false;
      if ((local_68 != (Node *)0x0) && (bVar2 = false, local_68 != pNStack_20->parent)) {
        bVar2 = local_68 != pNVar1;
      }
      if (!bVar2) break;
      local_68->closed = yes;
      prvTidyReport((TidyDocImpl *)basenode_local,local_68->parent,local_68,0x259);
      local_68 = local_68->parent;
    }
    if (mp._4_4_ == 0) {
      if (local_68 != (Node *)0x0) {
        local_68->closed = yes;
      }
      prvTidyFreeNode((TidyDocImpl *)basenode_local,parent);
      parent = local_68;
      if (local_68 == (Node *)0x0) {
        local_78 = (Node *)0x0;
      }
      else {
        local_78 = local_68->parent;
      }
      pNStack_40 = local_78;
    }
    else {
      prvTidyUngetToken((TidyDocImpl *)basenode_local);
      parent = pNStack_20;
      pNStack_40 = pNStack_20->parent;
    }
  } while (parent != pNStack_20);
  *(undefined4 *)&node[1].attributes = av._4_4_;
  if ((pNStack_20 != (Node *)0x0) && (pNStack_20->closed == yes)) {
    return (Node *)0x0;
  }
  __assert_fail("basenode && basenode->closed == yes",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/parser.c",
                0x100f,"Node *prvTidyParseNamespace(TidyDocImpl *, Node *, GetTokenMode)");
}

Assistant:

Node* TY_(ParseNamespace)( TidyDocImpl* doc, Node *basenode, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    Node *parent = basenode;
    uint istackbase;
    AttVal* av; /* #130 MathML attr and entity fix! */

    /* a la <table>: defer popping elements off the inline stack */
    TY_(DeferDup)( doc );
    istackbase = lexer->istackbase;
    lexer->istackbase = lexer->istacksize;

    mode = OtherNamespace; /* Preformatted; IgnoreWhitespace; */

    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        /*
        fix check to skip action in InsertMisc for regular/empty
        nodes, which we don't want here...

        The way we do it here is by checking and processing everything
        and only what remains goes into InsertMisc()
        */

        /* is this a close tag? And does it match the current parent node? */
        if (node->type == EndTag)
        {
            /*
            to prevent end tags flowing from one 'alternate namespace' we
            check this in two phases: first we check if the tag is a
            descendant of the current node, and when it is, we check whether
            it is the end tag for a node /within/ or /outside/ the basenode.
            */
            Bool outside;
            Node *mp = FindMatchingDescendant(parent, node, basenode, &outside);

            if (mp != NULL)
            {
                /*
                when mp != parent as we might expect,
                infer end tags until we 'hit' the matched
                parent or the basenode
                */
                Node *n;

                for (n = parent;
                     n != NULL && n != basenode->parent && n != mp;
                     n = n->parent)
                {
                    /* n->implicit = yes; */
                    n->closed = yes;
                    TY_(Report)(doc, n->parent, n, MISSING_ENDTAG_BEFORE);
                }

                /* Issue #369 - Since 'assert' is DEBUG only, and there are
                   simple cases where these can be fired, removing them
                   pending feedback from the original author!
                   assert(outside == no ? n == mp : 1);
                   assert(outside == yes ? n == basenode->parent : 1);
                   =================================================== */

                if (outside == no)
                {
                    /* EndTag for a node within the basenode subtree. Roll on... */
                    if (n)
                        n->closed = yes;
                    TY_(FreeNode)(doc, node);

                    node = n;
                    parent = node ? node->parent : NULL;
                }
                else
                {
                    /* EndTag for a node outside the basenode subtree: let the caller handle that. */
                    TY_(UngetToken)( doc );
                    node = basenode;
                    parent = node->parent;
                }

                /* when we've arrived at the end-node for the base node, it's quitting time */
                if (node == basenode)
                {
                    lexer->istackbase = istackbase;
                    assert(basenode && basenode->closed == yes);
                    return NULL;
                }
            }
            else
            {
                /* unmatched close tag: report an error and discard */
                /* TY_(Report)(doc, parent, node, NON_MATCHING_ENDTAG); Issue #308 - Seems wrong warning! */
                TY_(Report)(doc, parent, node, DISCARDING_UNEXPECTED);
                assert(parent);
                /* assert(parent->tag != node->tag); Issue #308 - Seems would always be true! */
                TY_(FreeNode)( doc, node); /* Issue #308 - Discard unexpected end tag memory */
            }
        }
        else if (node->type == StartTag)
        {
            /* #130 MathML attr and entity fix!
               care if it has attributes, and 'accidently' any of those attributes match known */
            for ( av = node->attributes; av; av = av->next )
            {
                av->dict = 0; /* does something need to be freed? */
            }
            /* add another child to the current parent */
            TY_(InsertNodeAtEnd)(parent, node);
            parent = node;
        }
        else
        {
            /* #130 MathML attr and entity fix!
               care if it has attributes, and 'accidently' any of those attributes match known */
            for ( av = node->attributes; av; av = av->next )
            {
                av->dict = 0; /* does something need to be freed? */
            }
            TY_(InsertNodeAtEnd)(parent, node);
        }
    }

    TY_(Report)(doc, basenode->parent, basenode, MISSING_ENDTAG_FOR);
    return NULL;
}